

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
  *pFVar3;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
  *pFVar4;
  FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *pFVar5;
  FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *pFVar6;
  value_type vVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  vVar7 = FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
          ::fastAccessDx(&this->left_->fadexpr_,i);
  dVar8 = cos((this->right_->fadexpr_).expr_.val_);
  dVar1 = (this->right_->fadexpr_).expr_.dx_.ptr_to_data[i];
  dVar9 = sin((this->right_->fadexpr_).expr_.val_);
  pFVar3 = this->left_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  dVar2 = (pFVar4->fadexpr_).left_.constant_;
  pFVar5 = (pFVar4->fadexpr_).right_;
  dVar10 = sin((pFVar5->fadexpr_).expr_.fadexpr_.left_.constant_ *
               ((pFVar5->fadexpr_).expr_.fadexpr_.right_)->val_);
  pFVar6 = (pFVar3->fadexpr_).right_;
  dVar11 = cos((pFVar6->fadexpr_).expr_.fadexpr_.left_.constant_ *
               ((pFVar6->fadexpr_).expr_.fadexpr_.right_)->val_);
  return dVar8 * vVar7 - dVar11 * dVar10 * dVar2 * dVar9 * dVar1;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}